

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  ulong uVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  DataKey DVar9;
  ulong uVar10;
  uint *puVar11;
  pointer pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  pointer pnVar15;
  devexpr *pdVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_4e4;
  undefined1 local_4b8 [32];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [13];
  undefined3 uStack_44b;
  int iStack_448;
  bool bStack_444;
  undefined8 local_440;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_438;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  devexpr local_230 [112];
  int local_1c0;
  byte local_1bc;
  ulong local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  byte local_3c;
  ulong local_38;
  
  bVar21 = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_3b0,-1,(type *)0x0);
  local_440 = 0x1c00000000;
  local_4b8._0_16_ = (undefined1  [16])0x0;
  local_4b8._16_16_ = (undefined1  [16])0x0;
  local_498 = (undefined1  [16])0x0;
  local_488 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  local_468 = (undefined1  [16])0x0;
  local_458 = SUB1613((undefined1  [16])0x0,0);
  uStack_44b = 0;
  iStack_448 = 0;
  bStack_444 = false;
  lVar19 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar19 < 1) {
    local_4e4 = -1;
  }
  else {
    uVar20 = lVar19 + 1;
    local_4e4 = -1;
    do {
      piVar8 = (this->bestPrices).super_IdxSet.idx;
      iVar7 = piVar8[uVar20 - 2];
      pnVar12 = pnVar2 + iVar7;
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
      }
      iStack_448 = pnVar2[iVar7].m_backend.exp;
      bStack_444 = pnVar2[iVar7].m_backend.neg;
      local_440._0_4_ = pnVar2[iVar7].m_backend.fpclass;
      local_440._4_4_ = pnVar2[iVar7].m_backend.prec_elem;
      pnVar13 = feastol;
      pcVar14 = &local_430;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pcVar14->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
      }
      local_430.exp = (feastol->m_backend).exp;
      local_430.neg = (feastol->m_backend).neg;
      local_430.fpclass = (feastol->m_backend).fpclass;
      local_430.prec_elem = (feastol->m_backend).prec_elem;
      if (local_430.data._M_elems[0] != 0 || local_430.fpclass != 0) {
        local_430.neg = (bool)(local_430.neg ^ 1);
      }
      if ((fpclass_type)local_440 == 2 || local_430.fpclass == 2) {
LAB_005a12fb:
        iVar6 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar6 + -1;
        piVar8[uVar20 - 2] = piVar8[(long)iVar6 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar7] = 0;
      }
      else {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_4b8,&local_430);
        if (-1 < iVar6) {
          piVar8 = (this->bestPrices).super_IdxSet.idx;
          goto LAB_005a12fb;
        }
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        pdVar16 = local_b0;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          *(uint *)pdVar16 = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          pdVar16 = pdVar16 + (ulong)bVar21 * -8 + 4;
        }
        local_40 = iStack_448;
        local_3c = bStack_444;
        local_38 = local_440;
        pnVar12 = pnVar3 + iVar7;
        pnVar15 = pnVar12;
        pnVar13 = &local_130;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar13->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar3[iVar7].m_backend.exp;
        local_130.m_backend.neg = pnVar3[iVar7].m_backend.neg;
        local_130.m_backend.fpclass = pnVar3[iVar7].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
        pnVar13 = feastol;
        pnVar17 = &local_1b0;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_430,local_b0,&local_130,&local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0);
        pcVar14 = &local_430;
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar18->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
        }
        iStack_448 = local_430.exp;
        bStack_444 = local_430.neg;
        local_440._0_4_ = local_430.fpclass;
        local_440._4_4_ = local_430.prec_elem;
        uVar10 = local_430._120_8_;
        if ((local_430.fpclass != 2) && ((best->m_backend).fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4b8,&best->m_backend);
          uVar10 = local_440 & 0xffffffff;
          if (0 < iVar6) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
            pnVar13 = best;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            (best->m_backend).exp = iStack_448;
            (best->m_backend).neg = bStack_444;
            (best->m_backend).fpclass = (fpclass_type)local_440;
            (best->m_backend).prec_elem = local_440._4_4_;
            pnVar15 = pnVar12;
            pnVar13 = &this->last;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + (ulong)bVar21 * -8 + 4);
            }
            (this->last).m_backend.exp = (pnVar12->m_backend).exp;
            (this->last).m_backend.neg = (pnVar12->m_backend).neg;
            iVar5 = (pnVar12->m_backend).prec_elem;
            (this->last).m_backend.fpclass = (pnVar12->m_backend).fpclass;
            (this->last).m_backend.prec_elem = iVar5;
            local_4e4 = iVar7;
          }
        }
        if (local_3b0.fpclass == cpp_dec_float_NaN || (int)uVar10 == 2) {
LAB_005a1538:
          if (local_3b0.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_430,0,(type *)0x0);
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3b0,&local_430);
            if (iVar7 < 0) goto LAB_005a1570;
          }
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4b8,&local_3b0);
          if (-1 < iVar7) {
            goto LAB_005a1538;
          }
LAB_005a1570:
          puVar11 = (uint *)local_4b8;
          pcVar14 = &local_3b0;
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            (pcVar14->data)._M_elems[0] = *puVar11;
            puVar11 = puVar11 + (ulong)bVar21 * -2 + 1;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_3b0.exp = iStack_448;
          local_3b0.neg = bStack_444;
          local_3b0.fpclass = (fpclass_type)local_440;
          local_3b0.prec_elem = local_440._4_4_;
        }
      }
      uVar20 = uVar20 - 1;
    } while (1 < uVar20);
  }
  lVar19 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->updateViols).super_IdxSet.num;
  if (0 < lVar19) {
    local_438 = &this->last;
    uVar20 = lVar19 + 1;
    do {
      pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar8 = (pSVar1->isInfeasible).data;
      iVar7 = (pSVar1->updateViols).super_IdxSet.idx[uVar20 - 2];
      uVar10 = local_440;
      if (piVar8[iVar7] == 1) {
        pnVar12 = pnVar2 + iVar7;
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar14->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
        }
        iStack_448 = pnVar2[iVar7].m_backend.exp;
        bStack_444 = pnVar2[iVar7].m_backend.neg;
        local_440._0_4_ = pnVar2[iVar7].m_backend.fpclass;
        local_440._4_4_ = pnVar2[iVar7].m_backend.prec_elem;
        pnVar13 = feastol;
        pcVar14 = &local_430;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pcVar14->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
        }
        local_430.exp = (feastol->m_backend).exp;
        local_430.neg = (feastol->m_backend).neg;
        local_430.fpclass = (feastol->m_backend).fpclass;
        local_430.prec_elem = (feastol->m_backend).prec_elem;
        if (local_430.data._M_elems[0] != 0 || local_430.fpclass != 0) {
          local_430.neg = (bool)(local_430.neg ^ 1);
        }
        if ((fpclass_type)local_440 != 2 && local_430.fpclass != 2) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_4b8,&local_430);
          if (iVar6 < 0) {
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
            pdVar16 = local_230;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              *(uint *)pdVar16 = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
              pdVar16 = pdVar16 + (ulong)bVar21 * -8 + 4;
            }
            local_1c0 = iStack_448;
            local_1bc = bStack_444;
            local_1b8 = local_440;
            pnVar12 = pnVar3 + iVar7;
            pnVar15 = pnVar12;
            pnVar13 = &local_2b0;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_2b0.m_backend.exp = pnVar3[iVar7].m_backend.exp;
            local_2b0.m_backend.neg = pnVar3[iVar7].m_backend.neg;
            local_2b0.m_backend.fpclass = pnVar3[iVar7].m_backend.fpclass;
            local_2b0.m_backend.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
            pnVar13 = feastol;
            pnVar17 = &local_330;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_330.m_backend.exp = (feastol->m_backend).exp;
            local_330.m_backend.neg = (feastol->m_backend).neg;
            local_330.m_backend.fpclass = (feastol->m_backend).fpclass;
            local_330.m_backend.prec_elem = (feastol->m_backend).prec_elem;
            devexpr::
            computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_430,local_230,&local_2b0,&local_330,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_230);
            pcVar14 = &local_430;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pcVar18->data)._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar14->data)->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar14 + ((ulong)bVar21 * -2 + 1) * 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar21 * -8 + 4);
            }
            iStack_448 = local_430.exp;
            bStack_444 = local_430.neg;
            uVar4._0_4_ = local_430.fpclass;
            uVar4._4_4_ = local_430.prec_elem;
            local_440._0_4_ = local_430.fpclass;
            local_440._4_4_ = local_430.prec_elem;
            uVar10 = local_440;
            if (((local_430.fpclass != 2) &&
                (uVar10 = uVar4, local_3b0.fpclass != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_4b8,&local_3b0),
               uVar10 = local_440, 0 < iVar6)) {
              if ((((fpclass_type)local_440 != cpp_dec_float_NaN) &&
                  ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
                 (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    ((cpp_dec_float<200U,_int,_void> *)local_4b8,&best->m_backend),
                 0 < iVar6)) {
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_4b8;
                pnVar13 = best;
                for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pnVar13->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + (ulong)bVar21 * -8 + 4);
                  pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar13 + ((ulong)bVar21 * -2 + 1) * 4);
                }
                (best->m_backend).exp = iStack_448;
                (best->m_backend).neg = bStack_444;
                (best->m_backend).fpclass = (fpclass_type)local_440;
                (best->m_backend).prec_elem = local_440._4_4_;
                pnVar15 = pnVar12;
                pnVar13 = local_438;
                for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pnVar13->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
                  pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
                  pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar13 + (ulong)bVar21 * -8 + 4);
                }
                (this->last).m_backend.exp = (pnVar12->m_backend).exp;
                (this->last).m_backend.neg = (pnVar12->m_backend).neg;
                iVar5 = (pnVar12->m_backend).prec_elem;
                (this->last).m_backend.fpclass = (pnVar12->m_backend).fpclass;
                (this->last).m_backend.prec_elem = iVar5;
                local_4e4 = iVar7;
              }
              (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->isInfeasible).data[iVar7] = 2;
              DIdxSet::addIdx(&this->bestPrices,iVar7);
              uVar10 = local_440;
            }
            goto LAB_005a16fe;
          }
          piVar8 = (((this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver)->isInfeasible).data;
        }
        piVar8[iVar7] = 0;
        uVar10 = local_440;
      }
LAB_005a16fe:
      local_440 = uVar10;
      uVar20 = uVar20 - 1;
    } while (1 < uVar20);
  }
  if (local_4e4 < 0) {
    DVar9.info = 0;
    DVar9.idx = -1;
  }
  else {
    DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,local_4e4);
  }
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperDim(R& best, R feastol)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = cTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indeces for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = cTest[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, cpen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = cpen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}